

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O2

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int iVar1;
  int inverse;
  
  inverse = (int)filtered_data;
  *filtered_data = *data;
  PredictLine_C(data + 1,data,filtered_data + 1,width + -1,inverse);
  iVar1 = 1;
  while( true ) {
    filtered_data = filtered_data + stride;
    if (height <= iVar1) break;
    PredictLine_C(data + stride,data,filtered_data,width,inverse);
    iVar1 = iVar1 + 1;
    data = data + stride;
  }
  return;
}

Assistant:

static void VerticalFilter_C(const uint8_t* data, int width, int height,
                             int stride, uint8_t* filtered_data) {
  DoVerticalFilter_C(data, width, height, stride, 0, height, 0, filtered_data);
}